

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O1

void __thiscall CTextRender::TextRefreshGlyphs(CTextRender *this,CTextCursor *pCursor)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  if (0 < (pCursor->m_Glyphs).num_elements) {
    uVar1 = this->m_pGlyphMap->m_NumTotalPages;
    if (uVar1 != pCursor->m_PageCountWhenDrawn) {
      if (0 < (pCursor->m_Glyphs).num_elements) {
        lVar2 = 0;
        lVar3 = 0;
        do {
          CGlyphMap::RenderGlyph
                    (this->m_pGlyphMap,
                     *(CGlyph **)((long)&((pCursor->m_Glyphs).list)->m_pGlyph + lVar2),true);
          lVar3 = lVar3 + 1;
          lVar2 = lVar2 + 0x40;
        } while (lVar3 < (pCursor->m_Glyphs).num_elements);
      }
      pCursor->m_PageCountWhenDrawn = this->m_pGlyphMap->m_NumTotalPages;
    }
    if (uVar1 != this->m_pGlyphMap->m_NumTotalPages) {
      dbg_msg("textrender","page %d mismatch after refresh, atlas might be too small.",(ulong)uVar1)
      ;
      return;
    }
  }
  return;
}

Assistant:

void CTextRender::TextRefreshGlyphs(CTextCursor *pCursor)
{
	int NumQuads = pCursor->m_Glyphs.size();
	if(NumQuads <= 0)
		return;

	int NumTotalPages = m_pGlyphMap->NumTotalPages();

	if(NumTotalPages != pCursor->m_PageCountWhenDrawn)
	{
		// pages were dropped, re-render glyphs
		for(int i = 0; i < pCursor->m_Glyphs.size(); ++i)
			m_pGlyphMap->RenderGlyph(pCursor->m_Glyphs[i].m_pGlyph, true);
		pCursor->m_PageCountWhenDrawn = m_pGlyphMap->NumTotalPages();
	}

	if(NumTotalPages != m_pGlyphMap->NumTotalPages())
	{
		dbg_msg("textrender", "page %d mismatch after refresh, atlas might be too small.", NumTotalPages);
	}
}